

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O0

LinTerms * __thiscall
mp::BucketAccum1Type<mp::LinTerms>::ExtractSum(BucketAccum1Type<mp::LinTerms> *this)

{
  bool bVar1;
  size_type sVar2;
  array<mp::LinTerms,_64UL> *in_RSI;
  LinTerms *in_RDI;
  size_t i_bucket;
  LinTerms *result;
  LinTerms *in_stack_fffffffffffffe18;
  LinTerms *in_stack_fffffffffffffe20;
  ulong i;
  LinTerms *this_00;
  undefined1 local_199;
  LinTerms *in_stack_ffffffffffffff60;
  LinTerms *in_stack_ffffffffffffff68;
  undefined8 local_20;
  
  this_00 = in_RDI;
  LinTerms::LinTerms(in_stack_fffffffffffffe20);
  local_20 = 0;
  do {
    i = local_20;
    sVar2 = std::array<mp::LinTerms,_64UL>::size(in_RSI);
    if (sVar2 <= i) {
LAB_0050ffe7:
      while( true ) {
        local_20 = local_20 + 1;
        sVar2 = std::array<mp::LinTerms,_64UL>::size(in_RSI);
        if (sVar2 <= local_20) break;
        bVar1 = HasBucket((BucketAccum1Type<mp::LinTerms> *)in_stack_fffffffffffffe20,
                          (size_t)in_stack_fffffffffffffe18);
        if (bVar1) {
          in_stack_fffffffffffffe20 = (LinTerms *)LinTerms::size((LinTerms *)0x51004f);
          local_199 = in_stack_fffffffffffffe20 == (LinTerms *)0x0;
          if (local_199) {
            ExtractBucket((BucketAccum1Type<mp::LinTerms> *)this_00,i);
          }
          else {
            ExtractBucket((BucketAccum1Type<mp::LinTerms> *)this_00,i);
            MergeSorted<mp::LinTerms>(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          }
          local_199 = !local_199;
          LinTerms::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          LinTerms::~LinTerms(in_stack_fffffffffffffe20);
          if (local_199) {
            LinTerms::~LinTerms(in_stack_fffffffffffffe20);
          }
        }
      }
      return in_RDI;
    }
    bVar1 = HasBucket((BucketAccum1Type<mp::LinTerms> *)in_stack_fffffffffffffe20,
                      (size_t)in_stack_fffffffffffffe18);
    if (bVar1) {
      ExtractBucket((BucketAccum1Type<mp::LinTerms> *)this_00,i);
      LinTerms::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      LinTerms::~LinTerms(in_stack_fffffffffffffe20);
      goto LAB_0050ffe7;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

Body BucketAccum1Type<Body>::ExtractSum() {
  Body result;

  size_t i_bucket = 0;
  for ( ; i_bucket<buckets_.size(); ++i_bucket)
    if (HasBucket(i_bucket)) {
      result = ExtractBucket(i_bucket);
      break;
    }

  while ( ++i_bucket<buckets_.size())
    if (HasBucket(i_bucket)) {
      result
          = result.size()
          ? MergeSorted(ExtractBucket(i_bucket), result)
          : ExtractBucket(i_bucket);
    }

  return result;
}